

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_init.c
# Opt level: O1

GLFWbool loadCursorTheme(void)

{
  wl_compositor *pwVar1;
  PFN_wl_proxy_marshal_flags p_Var2;
  uint32_t uVar3;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  
  pcVar4 = getenv("XCURSOR_SIZE");
  if (pcVar4 == (char *)0x0) {
    iVar7 = 0x10;
  }
  else {
    piVar5 = __errno_location();
    *piVar5 = 0;
    lVar6 = strtol(pcVar4,(char **)0x0,10);
    iVar7 = (int)lVar6;
    if (0x7ffffffd < lVar6 - 1U) {
      iVar7 = 0x10;
    }
    if (*piVar5 != 0) {
      iVar7 = 0x10;
    }
  }
  pcVar4 = getenv("XCURSOR_THEME");
  _glfw.wl.cursorTheme = (*_glfw.wl.cursor.theme_load)(pcVar4,iVar7,_glfw.wl.shm);
  bVar8 = _glfw.wl.cursorTheme == (wl_cursor_theme *)0x0;
  if (bVar8) {
    _glfwInputError(0x10008,"Wayland: Failed to load default cursor theme");
  }
  else {
    _glfw.wl.cursorThemeHiDPI = (*_glfw.wl.cursor.theme_load)(pcVar4,iVar7 * 2,_glfw.wl.shm);
    p_Var2 = _glfw.wl.client.proxy_marshal_flags;
    pwVar1 = _glfw.wl.compositor;
    uVar3 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.compositor);
    _glfw.wl.cursorSurface =
         (wl_surface *)(*p_Var2)((wl_proxy *)pwVar1,0,&_glfw_wl_surface_interface,uVar3,0,0);
    _glfw.wl.cursorTimerfd = timerfd_create(1,0x80800);
  }
  return (uint)!bVar8;
}

Assistant:

static GLFWbool loadCursorTheme(void)
{
    int cursorSize = 16;

    const char* sizeString = getenv("XCURSOR_SIZE");
    if (sizeString)
    {
        errno = 0;
        const long cursorSizeLong = strtol(sizeString, NULL, 10);
        if (errno == 0 && cursorSizeLong > 0 && cursorSizeLong < INT_MAX)
            cursorSize = (int) cursorSizeLong;
    }

    const char* themeName = getenv("XCURSOR_THEME");

    _glfw.wl.cursorTheme = wl_cursor_theme_load(themeName, cursorSize, _glfw.wl.shm);
    if (!_glfw.wl.cursorTheme)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to load default cursor theme");
        return GLFW_FALSE;
    }

    // If this happens to be NULL, we just fallback to the scale=1 version.
    _glfw.wl.cursorThemeHiDPI =
        wl_cursor_theme_load(themeName, cursorSize * 2, _glfw.wl.shm);

    _glfw.wl.cursorSurface = wl_compositor_create_surface(_glfw.wl.compositor);
    _glfw.wl.cursorTimerfd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC | TFD_NONBLOCK);
    return GLFW_TRUE;
}